

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O2

void __thiscall
burst::
difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>
::maintain_invariant
          (difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>
           *this)

{
  char *pcVar1;
  char *pcVar2;
  
  while ((pcVar1 = (this->m_subtrahend_begin)._M_current,
         pcVar1 != (this->m_subtrahend_end)._M_current &&
         (pcVar2 = (this->m_minuend_begin)._M_current, pcVar2 != (this->m_minuend_end)._M_current)))
  {
    if (*pcVar2 < *pcVar1) {
      return;
    }
    if (*pcVar2 <= *pcVar1) {
      (this->m_minuend_begin)._M_current = pcVar2 + 1;
      (this->m_subtrahend_begin)._M_current = pcVar1 + 1;
    }
    drop_subtrahend_head(this);
  }
  return;
}

Assistant:

void maintain_invariant ()
        {
            while (m_subtrahend_begin != m_subtrahend_end
                && m_minuend_begin != m_minuend_end
                && not m_compare(*m_minuend_begin, *m_subtrahend_begin))
            {
                if (not m_compare(*m_subtrahend_begin, *m_minuend_begin))
                {
                    ++m_minuend_begin;
                    ++m_subtrahend_begin;
                }
                drop_subtrahend_head();
            }
        }